

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

MainBuilder * __thiscall
kj::MainBuilder::callAfterParsing
          (MainBuilder *this,Function<kj::MainBuilder::Validity_()> *callback)

{
  Impl *pIVar1;
  Fault f;
  Fault local_10;
  
  pIVar1 = (this->impl).ptr;
  if ((pIVar1->finalCallback).ptr.isSet == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,399,FAILED,"impl->finalCallback == nullptr",
               "\"callAfterParsing() can only be called once\"",
               (char (*) [43])"callAfterParsing() can only be called once");
    _::Debug::Fault::fatal(&local_10);
  }
  if ((pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    _::NullableValue<kj::Function<kj::MainBuilder::Validity()>>::
    emplace<kj::Function<kj::MainBuilder::Validity()>>
              ((NullableValue<kj::Function<kj::MainBuilder::Validity()>> *)&pIVar1->finalCallback,
               callback);
    return this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
             ,400,FAILED,"impl->subCommands.empty()",
             "\"cannot have a final callback when accepting sub-commands\"",
             (char (*) [57])"cannot have a final callback when accepting sub-commands");
  _::Debug::Fault::fatal(&local_10);
}

Assistant:

MainBuilder& MainBuilder::callAfterParsing(Function<Validity()> callback) {
  KJ_REQUIRE(impl->finalCallback == nullptr, "callAfterParsing() can only be called once");
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have a final callback when accepting sub-commands");
  impl->finalCallback = kj::mv(callback);
  return *this;
}